

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCut.c
# Opt level: O0

void Lpk_NodePrintCut(Lpk_Man_t *p,Lpk_Cut_t *pCut,int fLeavesOnly)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int local_2c;
  int i;
  Abc_Obj_t *pObj;
  int fLeavesOnly_local;
  Lpk_Cut_t *pCut_local;
  Lpk_Man_t *p_local;
  
  if (fLeavesOnly == 0) {
    printf("LEAVES:\n");
  }
  for (local_2c = 0; local_2c < (int)(*(uint *)pCut & 0x3f); local_2c = local_2c + 1) {
    pAVar2 = Abc_NtkObj(p->pNtk,pCut->pLeaves[local_2c]);
    printf("%d,",(ulong)(uint)pAVar2->Id);
  }
  if (fLeavesOnly == 0) {
    printf("\nNODES:\n");
    for (local_2c = 0; local_2c < (int)(*(uint *)pCut >> 6 & 0x3f); local_2c = local_2c + 1) {
      pAVar2 = Abc_NtkObj(p->pNtk,pCut->pNodes[local_2c]);
      printf("%d,",(ulong)(uint)pAVar2->Id);
      iVar1 = Abc_ObjIsNode(pAVar2);
      if (iVar1 == 0) {
        __assert_fail("Abc_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCut.c"
                      ,0x1b4,"void Lpk_NodePrintCut(Lpk_Man_t *, Lpk_Cut_t *, int)");
      }
    }
    printf("\n");
  }
  return;
}

Assistant:

void Lpk_NodePrintCut( Lpk_Man_t * p, Lpk_Cut_t * pCut, int fLeavesOnly )
{
    Abc_Obj_t * pObj;
    int i;
    if ( !fLeavesOnly )
        printf( "LEAVES:\n" );
    Lpk_CutForEachLeaf( p->pNtk, pCut, pObj, i )
        printf( "%d,", pObj->Id );
    if ( !fLeavesOnly )
    {
        printf( "\nNODES:\n" );
        Lpk_CutForEachNode( p->pNtk, pCut, pObj, i )
        {
            printf( "%d,", pObj->Id );
            assert( Abc_ObjIsNode(pObj) );
        }
        printf( "\n" );
    }
}